

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTP.h
# Opt level: O0

ArrayTP<int,_5> * __thiscall
L14_4::ArrayTP<L14_4::ArrayTP<int,_5>,_10>::operator[]
          (ArrayTP<int,_5> *__return_storage_ptr__,ArrayTP<L14_4::ArrayTP<int,_5>,_10> *this,int i)

{
  ostream *poVar1;
  int i_local;
  ArrayTP<L14_4::ArrayTP<int,_5>,_10> *this_local;
  
  if ((-1 < i) && (i < 0xb)) {
    ArrayTP<int,_5>::ArrayTP(__return_storage_ptr__,this->ar + i);
    return __return_storage_ptr__;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in array limits: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  std::operator<<(poVar1," is out of range\n");
  exit(1);
}

Assistant:

T ArrayTP<T, n>::operator[](int i) const {
        //  same as previous?
        if(i < 0 || i > n) {
            //  cerr: something link console.error?
            std::cerr << "Error in array limits: " << i << " is out of range\n";
            //  exit: something like process.exit()?
            std::exit(EXIT_FAILURE);
        }
        //  this return an address, I.E a reference
        return ar[i];
    }